

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

void selection_handles_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Object for_obj;
  Am_Object handle_shape;
  Am_Style special_style;
  Am_Object sel_handles_widget;
  Am_Style style;
  Am_Value value;
  Am_Move_Grow_Where_Attach local_80;
  Am_Style local_78;
  Am_Object local_70;
  Am_Object win;
  int offy;
  int offx;
  Am_Drawonable *local_50;
  Am_Style local_48;
  Am_Style local_40;
  Am_Style local_38;
  
  for_obj.data = (Am_Object_Data *)0x0;
  local_50 = draw;
  pAVar7 = Am_Object::Get(self,0xa3,0);
  Am_Object::operator=(&for_obj,pAVar7);
  bVar1 = Am_Object::Valid(&for_obj);
  if (bVar1) {
    value.type = 0;
    value.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar7 = Am_Object::Get(&for_obj,0xdb,1);
    Am_Value::operator=(&value,pAVar7);
    bVar1 = Am_Value::Valid(&value);
    Am_Style::Am_Style(&style);
    pAVar7 = Am_Object::Get(self,0x6a,0);
    Am_Style::operator=(&style,pAVar7);
    Am_Object::Get_Object((Am_Object *)&special_style,(Am_Slot_Key)self,10);
    Am_Object::Get_Object(&sel_handles_widget,(Am_Slot_Key)&special_style,10);
    Am_Object::~Am_Object((Am_Object *)&special_style);
    bVar2 = Am_Style::Valid(&style);
    if (!bVar2) {
      pAVar7 = Am_Object::Get(&sel_handles_widget,0x6a,0);
      Am_Style::operator=(&style,pAVar7);
    }
    Am_Style::Am_Style(&special_style,&Am_No_Style);
    local_80 = (Am_Move_Grow_Where_Attach)Am_ATTACH_WHERE_HIT.value;
    pAVar7 = Am_Object::Get(&sel_handles_widget,0x1a3,1);
    Am_Value::operator=(&value,pAVar7);
    bVar2 = Am_Value::Valid(&value);
    if (bVar2) {
      Am_Style::operator=(&special_style,&value);
      pAVar7 = Am_Object::Get(&sel_handles_widget,0x1a4,1);
      Am_Value::operator=(&value,pAVar7);
      bVar2 = Am_Value::Valid(&value);
      if (bVar2) {
        Am_Object::Am_Object(&handle_shape,&value);
        bVar2 = Am_Object::operator==(&handle_shape,&for_obj);
        Am_Object::~Am_Object(&handle_shape);
        if (bVar2) {
          pAVar7 = Am_Object::Get(&sel_handles_widget,0x1a5,0);
          handle_shape.data._0_4_ = 0;
          if ((pAVar7->type != 1) &&
             (pAVar7->type != Am_Move_Grow_Where_Attach::Am_Move_Grow_Where_Attach_ID)) {
            Am_Move_Grow_Where_Attach::TypeError((Am_Move_Grow_Where_Attach *)&handle_shape,pAVar7);
          }
          local_80.value = *(Am_Move_Grow_Where_Attach_vals *)&pAVar7->value;
        }
      }
    }
    pAVar7 = Am_Object::Get(&sel_handles_widget,0x1a7,1);
    Am_Object::Am_Object(&handle_shape,pAVar7);
    if (bVar1) {
      pAVar7 = Am_Object::Get(&for_obj,0x8b,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&for_obj,0x8c,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&for_obj,0x8d,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(&for_obj,0x8e,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x68,0);
      Am_Object::Am_Object(&win,pAVar7);
      Am_Object::Get_Object(&local_70,(Am_Slot_Key)&for_obj,10);
      Am_Translate_Coordinates(&local_70,0,0,&win,&offx,&offy);
      Am_Object::~Am_Object(&local_70);
      Am_Style::Am_Style(&local_78,&style);
      Am_Style::Am_Style(&local_38,&special_style);
      draw_2_handles_for_line
                (iVar3 + offx,iVar4 + offy,iVar5 + offx,iVar6 + offy,true,local_50,&local_78,
                 &handle_shape,&local_38,local_80);
      Am_Style::~Am_Style(&local_38);
      Am_Style::~Am_Style(&local_78);
      Am_Object::~Am_Object(&win);
    }
    else {
      pAVar7 = Am_Object::Get(self,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x65,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x66,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar7);
      pAVar7 = Am_Object::Get(self,0x67,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar7);
      Am_Style::Am_Style(&local_40,&style);
      Am_Style::Am_Style(&local_48,&special_style);
      draw_8_handles_for_rect
                (iVar3 + x_offset,iVar4 + y_offset,iVar5,iVar6,true,local_50,&local_40,&handle_shape
                 ,&local_48,local_80);
      Am_Style::~Am_Style(&local_48);
      Am_Style::~Am_Style(&local_40);
    }
    Am_Object::~Am_Object(&handle_shape);
    Am_Style::~Am_Style(&special_style);
    Am_Object::~Am_Object(&sel_handles_widget);
    Am_Style::~Am_Style(&style);
    Am_Value::~Am_Value(&value);
  }
  Am_Object::~Am_Object(&for_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, selection_handles_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  Am_Object for_obj;
  for_obj = self.Get(Am_ITEM);

  if (for_obj.Valid()) { //otherwise don't draw anything
    Am_Value value;
    value = for_obj.Peek(Am_AS_LINE);
    bool as_line = value.Valid();

    Am_Style style;
    style = self.Get(Am_FILL_STYLE);
    Am_Object sel_handles_widget = self.Get_Owner().Get_Owner();
    if (!style.Valid()) {
      //get from owner's owner so don't need a constraint
      //owner must be valid if I am being drawn
      style = sel_handles_widget.Get(Am_FILL_STYLE);
    }
    Am_Style special_style = Am_No_Style;
    Am_Move_Grow_Where_Attach special_style_where = Am_ATTACH_WHERE_HIT; //0
    value = sel_handles_widget.Peek(Am_SELECT_CLOSEST_POINT_STYLE);
    if (value.Valid()) {
      special_style = value;
      value = sel_handles_widget.Peek(Am_SELECT_CLOSEST_POINT_OBJ);
      if (value.Valid() && Am_Object(value) == for_obj) {
        special_style_where = (Am_Move_Grow_Where_Attach)sel_handles_widget.Get(
            Am_SELECT_CLOSEST_POINT_WHERE);
      }
    }

    // supports multiple users
    Am_Object handle_shape = sel_handles_widget.Peek(Am_SPECIAL_HANDLE);

    // std::cout << "--Drawing " << self << " for obj " << for_obj << " as line "
    //	 << as_line << " l,t,w,h (" << left << ","
    //	 << top << "," << width << "," << height << ")\n" <<std::flush;
    if (as_line) {
      int x1 = for_obj.Get(Am_X1);
      int y1 = for_obj.Get(Am_Y1);
      int x2 = for_obj.Get(Am_X2);
      int y2 = for_obj.Get(Am_Y2);
      int offx, offy;
      Am_Object win = self.Get(Am_WINDOW);
      Am_Translate_Coordinates(for_obj.Get_Owner(), 0, 0, win, offx, offy);
      draw_2_handles_for_line(x1 + offx, y1 + offy, x2 + offx, y2 + offy, true,
                              draw, style,
                              handle_shape, // supports multiple users
                              special_style, special_style_where);
    } else {
      int left = (int)self.Get(Am_LEFT) + x_offset;
      int top = (int)self.Get(Am_TOP) + y_offset;
      int width = self.Get(Am_WIDTH);
      int height = self.Get(Am_HEIGHT);
      draw_8_handles_for_rect(left, top, width, height, true, draw, style,
                              handle_shape, // supports multiple users
                              special_style, special_style_where);
    }
  }
}